

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1.c
# Opt level: O1

int ptls_asn1_validation(uint8_t *bytes,size_t length,ptls_minicrypto_log_ctx_t *log_ctx)

{
  size_t sVar1;
  int decode_error;
  int local_1c;
  
  local_1c = 0;
  sVar1 = ptls_asn1_validation_recursive(bytes,length,&local_1c,0,log_ctx);
  if ((sVar1 < length && local_1c == 0) &&
     (local_1c = 0x238, log_ctx != (ptls_minicrypto_log_ctx_t *)0x0)) {
    (*log_ctx->fn)(log_ctx->ctx,"Type too short, %d bytes only out of %d\n",sVar1 & 0xffffffff,
                   length & 0xffffffff);
  }
  return local_1c;
}

Assistant:

int ptls_asn1_validation(const uint8_t *bytes, size_t length, ptls_minicrypto_log_ctx_t *log_ctx)
{
    int decode_error = 0;
    size_t decoded = ptls_asn1_validation_recursive(bytes, length, &decode_error, 0, log_ctx);

    if (decode_error == 0 && decoded < length) {
        decode_error = PTLS_ERROR_BER_ELEMENT_TOO_SHORT;
        if (log_ctx != NULL) {
            log_ctx->fn(log_ctx->ctx, "Type too short, %d bytes only out of %d\n", (int)decoded, (int)length);
        }
    }

    return decode_error;
}